

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O3

void __thiscall OpenMD::RigidBody::updateAtomVel(RigidBody *this,int frame)

{
  undefined4 *puVar1;
  double dVar2;
  Atom *pAVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint i_2;
  int iVar7;
  undefined4 extraout_var;
  double *pdVar8;
  undefined4 extraout_var_00;
  pointer pVVar9;
  undefined4 extraout_var_01;
  double *pdVar10;
  ulong uVar11;
  uint j;
  long lVar12;
  double *pdVar13;
  uint k;
  long lVar14;
  uint i;
  long lVar15;
  double (*__return_storage_ptr__) [3];
  ulong uVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  Vector<double,_3U> result_3;
  SquareMatrix3<double> result;
  Vector<double,_3U> result_2;
  Mat3x3d mat;
  Mat3x3d I;
  double local_1f8 [4];
  double local_1d8 [10];
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_168;
  uint uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  double local_158 [10];
  double local_108 [17];
  double local_80;
  double local_78;
  undefined1 local_70 [16];
  double local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  double local_40;
  undefined8 local_38;
  
  iVar7 = (*((this->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
  lVar12 = (long)(this->super_StuntDouble).localIndex_;
  lVar15 = *(long *)(CONCAT44(extraout_var,iVar7) + 0x60 + (this->super_StuntDouble).storage_);
  local_178 = *(undefined8 *)(lVar15 + 0x10 + lVar12 * 0x18);
  local_168 = (undefined4)local_178;
  uStack_170 = 0;
  uStack_164 = (uint)((ulong)local_178 >> 0x20) ^ 0x80000000;
  uStack_160 = 0;
  uStack_15c = 0x80000000;
  puVar1 = (undefined4 *)(lVar15 + lVar12 * 0x18);
  local_188 = *puVar1;
  uStack_184 = puVar1[1];
  uStack_180 = puVar1[2];
  uStack_17c = puVar1[3];
  (*(this->super_StuntDouble)._vptr_StuntDouble[5])(local_108 + 9,this);
  lVar15 = 0;
  local_78 = 0.0;
  auVar6._8_4_ = uStack_180;
  auVar6._0_8_ = CONCAT44(uStack_184,local_188);
  auVar6._12_4_ = uStack_17c;
  auVar18._8_8_ = auVar6._8_8_ ^ 0x8000000000000000;
  auVar18._0_8_ = local_178;
  local_60 = (double)CONCAT44(uStack_164,local_168) / local_80;
  uVar17 = (undefined4)((ulong)local_108[0xd] >> 0x20);
  auVar4._8_4_ = SUB84(local_108[0xd],0);
  auVar4._0_8_ = local_80;
  auVar4._12_4_ = uVar17;
  local_70 = divpd(auVar18,auVar4);
  local_58 = 0;
  local_40 = -(double)CONCAT44(uStack_184,local_188) / local_108[9];
  auVar5._8_4_ = SUB84(local_108[0xd],0);
  auVar5._0_8_ = local_108[9];
  auVar5._12_4_ = uVar17;
  local_50 = divpd(auVar6,auVar5);
  local_38 = 0;
  __return_storage_ptr__ = (double (*) [3])local_158;
  StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,&this->super_StuntDouble,frame);
  local_1d8[8] = 0.0;
  local_1d8[6] = 0.0;
  local_1d8[7] = 0.0;
  local_1d8[4] = 0.0;
  local_1d8[5] = 0.0;
  local_1d8[2] = 0.0;
  local_1d8[3] = 0.0;
  local_1d8[0] = 0.0;
  local_1d8[1] = 0.0;
  do {
    lVar12 = 0;
    pdVar10 = &local_78;
    do {
      dVar2 = local_1d8[lVar15 * 3 + lVar12];
      lVar14 = 0;
      pdVar8 = pdVar10;
      do {
        dVar2 = dVar2 + (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                        super_RectMatrix<double,_3U,_3U>).data_[0][lVar14] * *pdVar8;
        lVar14 = lVar14 + 1;
        pdVar8 = pdVar8 + 3;
      } while (lVar14 != 3);
      local_1d8[lVar15 * 3 + lVar12] = dVar2;
      lVar12 = lVar12 + 1;
      pdVar10 = pdVar10 + 1;
    } while (lVar12 != 3);
    lVar15 = lVar15 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar15 != 3);
  pdVar8 = local_108;
  local_108[6] = 0.0;
  local_108[7] = 0.0;
  local_108[4] = 0.0;
  local_108[5] = 0.0;
  local_108[2] = 0.0;
  local_108[3] = 0.0;
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  local_108[8] = 0.0;
  pdVar10 = local_1d8;
  lVar15 = 0;
  do {
    lVar12 = 0;
    pdVar13 = pdVar8;
    do {
      *pdVar13 = pdVar10[lVar12];
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 3;
    } while (lVar12 != 3);
    lVar15 = lVar15 + 1;
    pdVar8 = pdVar8 + 1;
    pdVar10 = pdVar10 + 3;
  } while (lVar15 != 3);
  iVar7 = (*((this->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
  lVar12 = (long)(this->super_StuntDouble).localIndex_;
  lVar15 = *(long *)(CONCAT44(extraout_var_00,iVar7) + 0x18 + (this->super_StuntDouble).storage_);
  local_1d8[2] = (double)*(undefined8 *)(lVar15 + 0x10 + lVar12 * 0x18);
  pdVar10 = (double *)(lVar15 + lVar12 * 0x18);
  local_1d8[0] = *pdVar10;
  local_1d8[1] = pdVar10[1];
  pVVar9 = (this->refCoords_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->refCoords_).
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pVVar9) {
    uVar16 = 0;
    do {
      pAVar3 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar16];
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar15 = 0;
      pdVar10 = local_108;
      do {
        dVar2 = local_158[lVar15];
        lVar12 = 0;
        do {
          dVar2 = dVar2 + pdVar10[lVar12] * pVVar9[uVar16].super_Vector<double,_3U>.data_[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_158[lVar15] = dVar2;
        lVar15 = lVar15 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar15 != 3);
      local_1f8[0] = 0.0;
      local_1f8[1] = 0.0;
      local_1f8[2] = 0.0;
      lVar15 = 0;
      do {
        local_1f8[lVar15] = local_1d8[lVar15] + local_158[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      iVar7 = (*((pAVar3->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
      lVar12 = (long)(pAVar3->super_StuntDouble).localIndex_;
      lVar15 = *(long *)(CONCAT44(extraout_var_01,iVar7) + 0x18 +
                        (pAVar3->super_StuntDouble).storage_);
      pdVar10 = (double *)(lVar15 + lVar12 * 0x18);
      *pdVar10 = local_1f8[0];
      pdVar10[1] = local_1f8[1];
      *(double *)(lVar15 + 0x10 + lVar12 * 0x18) = local_1f8[2];
      uVar16 = (ulong)((int)uVar16 + 1);
      pVVar9 = (this->refCoords_).
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((long)(this->refCoords_).
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9 >> 3) *
               -0x5555555555555555;
    } while (uVar16 <= uVar11 && uVar11 - uVar16 != 0);
  }
  return;
}

Assistant:

void RigidBody::updateAtomVel(int frame) {
    Mat3x3d skewMat;
    ;

    Vector3d ji = getJ(frame);
    Mat3x3d I   = getI();

    skewMat(0, 0) = 0;
    skewMat(0, 1) = ji[2] / I(2, 2);
    skewMat(0, 2) = -ji[1] / I(1, 1);

    skewMat(1, 0) = -ji[2] / I(2, 2);
    skewMat(1, 1) = 0;
    skewMat(1, 2) = ji[0] / I(0, 0);

    skewMat(2, 0) = ji[1] / I(1, 1);
    skewMat(2, 1) = -ji[0] / I(0, 0);
    skewMat(2, 2) = 0;

    Mat3x3d mat    = (getA(frame) * skewMat).transpose();
    Vector3d rbVel = getVel(frame);

    Vector3d velRot;
    for (unsigned int i = 0; i < refCoords_.size(); ++i) {
      atoms_[i]->setVel(rbVel + mat * refCoords_[i], frame);
    }
  }